

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::snedecor_f_dist<double>::cdf(snedecor_f_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (double)(this->P).n_;
  dVar3 = (double)(this->P).m_;
  dVar1 = x * dVar2;
  dVar1 = math::Beta_I(dVar1 / (dVar1 + dVar3),dVar2 * 0.5,dVar3 * 0.5);
  return dVar1;
}

Assistant:

cdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      return math::Beta_I(n * x / (m + n * x), result_type(1) / result_type(2) * n,
                          result_type(1) / result_type(2) * m);
    }